

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pob-2250-rb.c
# Opt level: O0

int pob_recv_pkt(int sock,rtp_pkt_t *pkt)

{
  int iVar1;
  int *piVar2;
  int ret;
  fd_set *__arr;
  undefined1 local_a8 [4];
  uint __i;
  fd_set fds;
  timeval t_out;
  rtp_pkt_t *pkt_local;
  int sock_local;
  
  fds.__fds_bits[0xf] = 0;
  for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
    *(undefined8 *)(local_a8 + (ulong)__arr._4_4_ * 8) = 0;
  }
  *(ulong *)(local_a8 + (long)(sock / 0x40) * 8) =
       1L << ((byte)((long)sock % 0x40) & 0x3f) | *(ulong *)(local_a8 + (long)(sock / 0x40) * 8);
  iVar1 = select(sock + 1,(fd_set *)local_a8,(fd_set *)0x0,(fd_set *)0x0,
                 (timeval *)(fds.__fds_bits + 0xf));
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    if ((*piVar2 != 4) && (piVar2 = __errno_location(), *piVar2 != 0xb)) {
      perror("select");
      return -1;
    }
    pkt_local._4_4_ = 0;
  }
  else if ((*(ulong *)(local_a8 + (long)(sock / 0x40) * 8) &
           1L << ((byte)((long)sock % 0x40) & 0x3f)) == 0) {
    pkt_local._4_4_ = 0;
  }
  else {
    rtp_rfc2250_pkt_init(pkt);
    iVar1 = rtp_pkt_read(pkt,sock);
    if (iVar1 < 1) {
      pkt_local._4_4_ = -1;
    }
    else {
      pkt_local._4_4_ = 1;
    }
  }
  return pkt_local._4_4_;
}

Assistant:

int pob_recv_pkt(int sock, rtp_pkt_t *pkt) {
  struct timeval t_out;
  t_out.tv_sec  = 0;
  t_out.tv_usec = RTP_MINSLEEP;

  fd_set fds;
  FD_ZERO(&fds);
  FD_SET(sock, &fds);

  /*M
    Wait for network input or for timeout.
  **/
  int ret = select(sock + 1, &fds, NULL, NULL, &t_out);
  
  /*M
    Check for interrupted system call.
  **/
  if (ret == -1) {
    if ((errno == EINTR) || (errno == EAGAIN)) {
      return 0;
    } else {
      perror("select");
      return -1;
    }
  }
  
  /*M
    If there is network input, read incoming packet.
  **/
  if (FD_ISSET(sock, &fds)) {
    rtp_rfc2250_pkt_init(pkt);
    
    if (rtp_pkt_read(pkt, sock) <= 0) {
      return -1;
    } else {
      return 1;
    }
  }

  return 0;
}